

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# javanano_enum_field.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::javanano::RepeatedEnumFieldGenerator::GenerateSerializationCode
          (RepeatedEnumFieldGenerator *this,Printer *printer)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *variables;
  char *text;
  
  variables = &this->variables_;
  io::Printer::Print(printer,variables,"if (this.$name$ != null && this.$name$.length > 0) {\n");
  io::Printer::Indent(printer);
  if (*(char *)(*(long *)(this->descriptor_ + 0x80) + 0x6c) == '\x01') {
    io::Printer::Print(printer,variables,
                       "int dataSize = 0;\nfor (int i = 0; i < this.$name$.length; i++) {\n  int element = this.$name$[i];\n  dataSize += com.google.protobuf.nano.CodedOutputByteBufferNano\n      .computeInt32SizeNoTag(element);\n}\n"
                      );
    text = 
    "output.writeRawVarint32($tag$);\noutput.writeRawVarint32(dataSize);\nfor (int i = 0; i < this.$name$.length; i++) {\n  output.writeRawVarint32(this.$name$[i]);\n}\n"
    ;
  }
  else {
    text = 
    "for (int i = 0; i < this.$name$.length; i++) {\n  output.writeInt32($number$, this.$name$[i]);\n}\n"
    ;
  }
  io::Printer::Print(printer,variables,text);
  io::Printer::Outdent(printer);
  io::Printer::Print(printer,variables,"}\n");
  return;
}

Assistant:

void RepeatedEnumFieldGenerator::
GenerateSerializationCode(io::Printer* printer) const {
  printer->Print(variables_,
    "if (this.$name$ != null && this.$name$.length > 0) {\n");
  printer->Indent();

  if (descriptor_->options().packed()) {
    GenerateRepeatedDataSizeCode(printer);
    printer->Print(variables_,
      "output.writeRawVarint32($tag$);\n"
      "output.writeRawVarint32(dataSize);\n"
      "for (int i = 0; i < this.$name$.length; i++) {\n"
      "  output.writeRawVarint32(this.$name$[i]);\n"
      "}\n");
  } else {
    printer->Print(variables_,
      "for (int i = 0; i < this.$name$.length; i++) {\n"
      "  output.writeInt32($number$, this.$name$[i]);\n"
      "}\n");
  }

  printer->Outdent();
  printer->Print(variables_,
    "}\n");
}